

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O2

void line_to_examples_json<true>(vw *all,char *line,size_t num_chars,v_array<example_*> *examples)

{
  bool bVar1;
  example *local_18;
  
  bVar1 = parse_line_json<true>(all,line,num_chars,examples);
  if (bVar1) {
    prepare_for_learner(all,examples);
    return;
  }
  VW::return_multiple_example(all,examples);
  local_18 = VW::get_unused_example(all);
  v_array<example_*>::push_back(examples,&local_18);
  return;
}

Assistant:

void line_to_examples_json(vw* all, char* line, size_t num_chars, v_array<example*>& examples)
{
  bool good_example = parse_line_json<audit>(all, line, num_chars, examples);
  if (!good_example)
  {
    VW::return_multiple_example(*all, examples);
    examples.push_back(&VW::get_unused_example(all));
    return;
  }

  prepare_for_learner(all, examples);
}